

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenAtomicCmpxchg
          (BinaryenModuleRef module,BinaryenIndex bytes,BinaryenIndex offset,
          BinaryenExpressionRef ptr,BinaryenExpressionRef expected,BinaryenExpressionRef replacement
          ,BinaryenType type,char *memoryName)

{
  BinaryenExpressionRef replacement_00;
  BinaryenExpressionRef expected_00;
  BinaryenExpressionRef ptr_00;
  uint bytes_00;
  AtomicCmpxchg *pAVar1;
  Name memory;
  Type local_48;
  Address local_40;
  Builder local_38;
  BinaryenExpressionRef local_30;
  BinaryenExpressionRef replacement_local;
  BinaryenExpressionRef expected_local;
  BinaryenExpressionRef ptr_local;
  BinaryenIndex offset_local;
  BinaryenIndex bytes_local;
  BinaryenModuleRef module_local;
  
  local_30 = replacement;
  replacement_local = expected;
  expected_local = ptr;
  ptr_local._0_4_ = offset;
  ptr_local._4_4_ = bytes;
  _offset_local = module;
  wasm::Builder::Builder(&local_38,module);
  bytes_00 = ptr_local._4_4_;
  wasm::Address::Address(&local_40,(ulong)(BinaryenIndex)ptr_local);
  ptr_00 = expected_local;
  expected_00 = replacement_local;
  replacement_00 = local_30;
  wasm::Type::Type(&local_48,type);
  memory = getMemoryName(_offset_local,memoryName);
  pAVar1 = wasm::Builder::makeAtomicCmpxchg
                     (&local_38,bytes_00,local_40,ptr_00,expected_00,replacement_00,local_48,memory)
  ;
  return (BinaryenExpressionRef)pAVar1;
}

Assistant:

BinaryenExpressionRef BinaryenAtomicCmpxchg(BinaryenModuleRef module,
                                            BinaryenIndex bytes,
                                            BinaryenIndex offset,
                                            BinaryenExpressionRef ptr,
                                            BinaryenExpressionRef expected,
                                            BinaryenExpressionRef replacement,
                                            BinaryenType type,
                                            const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeAtomicCmpxchg(bytes,
                         offset,
                         (Expression*)ptr,
                         (Expression*)expected,
                         (Expression*)replacement,
                         Type(type),
                         getMemoryName(module, memoryName)));
}